

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O1

void ncnn::pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  size_t *psVar13;
  undefined1 (*pauVar14) [32];
  void *pvVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  undefined1 (*pauVar26) [16];
  int iVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  undefined1 (*pauVar33) [32];
  uint uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  long lVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_88;
  long local_80;
  long local_78;
  long local_50;
  
  iVar27 = A->elempack;
  psVar13 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar13 = &A->cstep;
  }
  pauVar33 = (undefined1 (*) [32])AT->data;
  uVar39 = 0;
  lVar38 = (long)k;
  lVar36 = (long)i;
  lVar28 = (long)(int)*psVar13;
  if (7 < max_ii) {
    lVar18 = (long)(k * 4) * 4;
    lVar32 = lVar18 + lVar28 * lVar36 * 4;
    lVar24 = (lVar36 + 4) * lVar28;
    lVar18 = lVar18 + lVar24 * 4;
    local_50 = lVar38 * 4;
    local_b8 = local_50 + lVar28 * lVar36 * 4;
    local_78 = local_50 + (lVar36 + 1) * lVar28 * 4;
    local_a0 = local_50 + (lVar36 + 2) * lVar28 * 4;
    local_a8 = local_50 + (lVar36 + 3) * lVar28 * 4;
    local_80 = local_50 + lVar24 * 4;
    local_b0 = local_50 + (lVar36 + 7) * lVar28 * 4;
    local_88 = local_50 + (lVar36 + 6) * lVar28 * 4;
    local_50 = local_50 + (lVar36 + 5) * lVar28 * 4;
    lVar24 = lVar28 * 0x20;
    uVar23 = 0;
    do {
      if (iVar27 == 8 && 0 < max_kk) {
        pauVar14 = (undefined1 (*) [32])
                   ((long)A->data + (long)(k * 8) * 4 + (uVar23 + lVar36) * lVar28 * 4);
        iVar17 = max_kk;
        do {
          *pauVar33 = *pauVar14;
          pauVar33 = pauVar33 + 1;
          pauVar14 = pauVar14 + 1;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      if (iVar27 == 4 && 0 < max_kk) {
        pvVar15 = A->data;
        iVar17 = max_kk;
        do {
          uVar12 = ((undefined8 *)((long)pvVar15 + lVar32))[1];
          *(undefined8 *)*pauVar33 = *(undefined8 *)((long)pvVar15 + lVar32);
          *(undefined8 *)(*pauVar33 + 8) = uVar12;
          *(undefined1 (*) [16])(*pauVar33 + 0x10) = *(undefined1 (*) [16])((long)pvVar15 + lVar18);
          pauVar33 = pauVar33 + 1;
          pvVar15 = (void *)((long)pvVar15 + 0x10);
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      if (iVar27 == 1) {
        pvVar15 = A->data;
        if (max_kk < 8) {
          lVar29 = lVar38 * 4 + (uVar23 + lVar36) * lVar28 * 4;
          lVar42 = lVar38 * 4 + (uVar23 + lVar36 + 1) * lVar28 * 4;
          lVar21 = lVar38 * 4 + (uVar23 + lVar36 + 2) * lVar28 * 4;
          lVar16 = lVar38 * 4 + (uVar23 + lVar36 + 3) * lVar28 * 4;
          lVar25 = lVar38 * 4 + (uVar23 + lVar36 + 4) * lVar28 * 4;
          lVar35 = lVar38 * 4 + (uVar23 + lVar36 + 5) * lVar28 * 4;
          lVar22 = lVar38 * 4 + (uVar23 + lVar36 + 6) * lVar28 * 4;
          lVar40 = lVar38 * 4 + (lVar36 + uVar23 + 7) * lVar28 * 4;
          uVar34 = 0;
        }
        else {
          iVar17 = 7;
          lVar35 = 0;
          pauVar14 = pauVar33;
          do {
            pauVar19 = pauVar14;
            pauVar14 = (undefined1 (*) [32])(*pauVar33 + lVar35 * 8);
            lVar29 = lVar35 + local_b8;
            auVar1 = *(undefined1 (*) [32])((long)pvVar15 + lVar35 + local_b8);
            lVar42 = lVar28 * 8 + lVar29;
            auVar43 = *(undefined1 (*) [32])((long)pvVar15 + lVar28 * 4 + lVar29);
            auVar44 = *(undefined1 (*) [32])((long)pvVar15 + lVar28 * 8 + lVar29);
            auVar2 = *(undefined1 (*) [32])((long)pvVar15 + lVar28 * 4 + lVar42);
            lVar29 = lVar28 * 8 + lVar42;
            auVar3 = *(undefined1 (*) [32])((long)pvVar15 + lVar28 * 8 + lVar42);
            lVar42 = lVar28 * 4 + lVar29;
            auVar45 = *(undefined1 (*) [32])((long)pvVar15 + lVar28 * 4 + lVar29);
            auVar4 = *(undefined1 (*) [32])((long)pvVar15 + lVar28 * 4 + lVar42);
            auVar5 = *(undefined1 (*) [32])((long)pvVar15 + lVar28 * 8 + lVar42);
            auVar11 = vunpcklps_avx(auVar1,auVar43);
            auVar43 = vunpckhps_avx(auVar1,auVar43);
            auVar1 = vunpcklps_avx(auVar44,auVar2);
            auVar44 = vunpckhps_avx(auVar44,auVar2);
            auVar46 = vunpcklps_avx(auVar3,auVar45);
            auVar2 = vunpckhps_avx(auVar3,auVar45);
            auVar47 = vunpcklps_avx(auVar4,auVar5);
            auVar3 = vunpckhps_avx(auVar4,auVar5);
            auVar45 = vunpcklpd_avx(auVar11,auVar1);
            auVar1 = vunpckhpd_avx(auVar11,auVar1);
            auVar4 = vunpcklpd_avx(auVar43,auVar44);
            auVar43 = vunpckhpd_avx(auVar43,auVar44);
            auVar5 = vunpcklpd_avx(auVar46,auVar47);
            auVar44 = vunpckhpd_avx(auVar46,auVar47);
            auVar11 = vunpcklpd_avx(auVar2,auVar3);
            auVar2 = vunpckhpd_avx(auVar2,auVar3);
            auVar46._16_16_ = auVar5._0_16_;
            auVar46._0_16_ = auVar45._0_16_;
            auVar47._16_16_ = auVar44._0_16_;
            auVar47._0_16_ = auVar1._0_16_;
            auVar48._16_16_ = auVar11._0_16_;
            auVar48._0_16_ = auVar4._0_16_;
            auVar49._16_16_ = auVar2._0_16_;
            auVar49._0_16_ = auVar43._0_16_;
            auVar3 = vperm2f128_avx(auVar45,auVar5,0x31);
            auVar1 = vperm2f128_avx(auVar1,auVar44,0x31);
            auVar44 = vperm2f128_avx(auVar4,auVar11,0x31);
            auVar43 = vperm2f128_avx(auVar43,auVar2,0x31);
            *pauVar14 = auVar46;
            pauVar14[1] = auVar47;
            pauVar14[2] = auVar48;
            pauVar14[3] = auVar49;
            pauVar14[4] = auVar3;
            pauVar14[5] = auVar1;
            pauVar14[6] = auVar44;
            pauVar14[7] = auVar43;
            lVar35 = lVar35 + 0x20;
            iVar17 = iVar17 + 8;
            pauVar14 = pauVar14 + 8;
          } while (iVar17 < max_kk);
          pauVar33 = pauVar19 + 8;
          lVar29 = lVar35 + local_b8;
          lVar42 = lVar35 + local_78;
          lVar21 = lVar35 + local_a0;
          lVar16 = lVar35 + local_a8;
          lVar25 = lVar35 + local_80;
          lVar40 = lVar35 + local_b0;
          lVar22 = lVar35 + local_88;
          lVar35 = lVar35 + local_50;
          uVar34 = max_kk & 0xfffffff8;
        }
        iVar17 = max_kk - uVar34;
        if (iVar17 != 0 && (int)uVar34 <= max_kk) {
          lVar31 = 0;
          lVar37 = 0;
          do {
            *(undefined4 *)(*pauVar33 + lVar37 * 8) =
                 *(undefined4 *)((long)pvVar15 + lVar37 + lVar29);
            *(undefined4 *)(*pauVar33 + lVar37 * 8 + 4) =
                 *(undefined4 *)((long)pvVar15 + lVar37 + lVar42);
            *(undefined4 *)(*pauVar33 + lVar37 * 8 + 8) =
                 *(undefined4 *)((long)pvVar15 + lVar37 + lVar21);
            *(undefined4 *)(*pauVar33 + lVar37 * 8 + 0xc) =
                 *(undefined4 *)((long)pvVar15 + lVar37 + lVar16);
            *(undefined4 *)(*pauVar33 + lVar37 * 8 + 0x10) =
                 *(undefined4 *)((long)pvVar15 + lVar37 + lVar25);
            *(undefined4 *)(*pauVar33 + lVar37 * 8 + 0x14) =
                 *(undefined4 *)((long)pvVar15 + lVar37 + lVar35);
            *(undefined4 *)(*pauVar33 + lVar37 * 8 + 0x18) =
                 *(undefined4 *)((long)pvVar15 + lVar37 + lVar22);
            *(undefined4 *)(*pauVar33 + lVar37 * 8 + 0x1c) =
                 *(undefined4 *)((long)pvVar15 + lVar37 + lVar40);
            lVar37 = lVar37 + 4;
            lVar31 = lVar31 + -0x20;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          pauVar33 = (undefined1 (*) [32])((long)pauVar33 - lVar31);
        }
      }
      uVar39 = uVar23 + 8;
      uVar20 = uVar23 + 0xf;
      lVar32 = lVar32 + lVar24;
      lVar18 = lVar18 + lVar24;
      local_b8 = local_b8 + lVar24;
      local_78 = local_78 + lVar24;
      local_a0 = local_a0 + lVar24;
      local_a8 = local_a8 + lVar24;
      local_80 = local_80 + lVar24;
      local_b0 = local_b0 + lVar24;
      local_88 = local_88 + lVar24;
      local_50 = local_50 + lVar24;
      uVar23 = uVar39;
    } while (uVar20 < (uint)max_ii);
  }
  lVar32 = (long)max_ii;
  if ((int)((uint)uVar39 | 3) < max_ii) {
    uVar23 = uVar39 & 0xffffffff;
    lVar42 = lVar38 * 4;
    lVar18 = lVar42 + (lVar36 + uVar23 + 3) * lVar28 * 4;
    lVar21 = lVar28 * 0x10;
    lVar24 = lVar42 + (lVar36 + uVar23 + 2) * lVar28 * 4;
    lVar29 = lVar42 + (lVar36 + uVar23 + 1) * lVar28 * 4;
    lVar42 = lVar42 + (lVar36 + uVar23) * lVar28 * 4;
    do {
      if (0 < max_kk && iVar27 == 4) {
        pauVar26 = (undefined1 (*) [16])
                   ((long)A->data + (long)(k * 4) * 4 + (lVar36 + uVar23) * lVar28 * 4);
        iVar17 = max_kk;
        do {
          *(undefined1 (*) [16])*pauVar33 = *pauVar26;
          pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
          pauVar26 = pauVar26 + 1;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      if (iVar27 == 1) {
        pvVar15 = A->data;
        if (max_kk < 8) {
          uVar34 = 0;
          lVar22 = lVar38 * 4 + (lVar36 + uVar23) * lVar28 * 4;
          lVar40 = lVar38 * 4 + (lVar36 + uVar23 + 1) * lVar28 * 4;
          lVar25 = lVar38 * 4 + (lVar36 + uVar23 + 2) * lVar28 * 4;
          lVar16 = lVar38 * 4 + (lVar36 + uVar23 + 3) * lVar28 * 4;
        }
        else {
          iVar17 = 7;
          lVar22 = 0;
          pauVar14 = pauVar33;
          do {
            pauVar19 = pauVar14;
            pauVar14 = (undefined1 (*) [32])(*pauVar33 + lVar22 * 4);
            auVar1 = *(undefined1 (*) [32])((long)pvVar15 + lVar22 + lVar42);
            auVar43 = *(undefined1 (*) [32])((long)pvVar15 + lVar22 + lVar29);
            auVar44 = *(undefined1 (*) [32])((long)pvVar15 + lVar22 + lVar24);
            auVar2 = *(undefined1 (*) [32])((long)pvVar15 + lVar22 + lVar18);
            auVar3 = vunpcklps_avx(auVar1,auVar43);
            auVar43 = vunpckhps_avx(auVar1,auVar43);
            auVar1 = vunpcklps_avx(auVar44,auVar2);
            auVar44 = vunpckhps_avx(auVar44,auVar2);
            auVar2 = vunpcklpd_avx(auVar3,auVar1);
            auVar1 = vunpckhpd_avx(auVar3,auVar1);
            auVar3 = vunpcklpd_avx(auVar43,auVar44);
            auVar43 = vunpckhpd_avx(auVar43,auVar44);
            auVar44._16_16_ = auVar1._0_16_;
            auVar44._0_16_ = auVar2._0_16_;
            auVar45._16_16_ = auVar43._0_16_;
            auVar45._0_16_ = auVar3._0_16_;
            auVar1 = vperm2f128_avx(auVar2,auVar1,0x31);
            auVar43 = vperm2f128_avx(auVar3,auVar43,0x31);
            *pauVar14 = auVar44;
            pauVar14[1] = auVar45;
            pauVar14[2] = auVar1;
            pauVar14[3] = auVar43;
            lVar22 = lVar22 + 0x20;
            iVar17 = iVar17 + 8;
            pauVar14 = pauVar14 + 4;
          } while (iVar17 < max_kk);
          pauVar33 = pauVar19 + 4;
          lVar16 = lVar22 + lVar18;
          lVar25 = lVar22 + lVar24;
          lVar40 = lVar22 + lVar29;
          lVar22 = lVar22 + lVar42;
          uVar34 = max_kk & 0xfffffff8;
        }
        lVar40 = (long)pvVar15 + lVar40;
        lVar25 = (long)pvVar15 + lVar25;
        lVar22 = (long)pvVar15 + lVar22;
        lVar16 = (long)pvVar15 + lVar16;
        if ((int)(uVar34 | 3) < max_kk) {
          lVar35 = 0;
          pauVar14 = pauVar33;
          uVar30 = uVar34;
          do {
            pauVar19 = pauVar14;
            auVar9 = vunpcklps_avx(*(undefined1 (*) [16])(lVar22 + lVar35),
                                   *(undefined1 (*) [16])(lVar40 + lVar35));
            auVar10 = vunpcklps_avx(*(undefined1 (*) [16])(lVar25 + lVar35),
                                    *(undefined1 (*) [16])(lVar16 + lVar35));
            auVar7 = vunpckhps_avx(*(undefined1 (*) [16])(lVar22 + lVar35),
                                   *(undefined1 (*) [16])(lVar40 + lVar35));
            auVar8 = vunpckhps_avx(*(undefined1 (*) [16])(lVar25 + lVar35),
                                   *(undefined1 (*) [16])(lVar16 + lVar35));
            auVar6 = vmovlhps_avx(auVar9,auVar10);
            auVar10 = vunpckhpd_avx(auVar9,auVar10);
            auVar9 = vmovlhps_avx(auVar7,auVar8);
            auVar7 = vunpckhpd_avx(auVar7,auVar8);
            pauVar14 = (undefined1 (*) [32])(pauVar33[2] + lVar35 * 4);
            *(undefined1 (*) [16])pauVar14[-2] = auVar6;
            *(undefined1 (*) [16])(pauVar14[-2] + 0x10) = auVar10;
            *(undefined1 (*) [16])pauVar14[-1] = auVar9;
            *(undefined1 (*) [16])(pauVar14[-1] + 0x10) = auVar7;
            uVar34 = uVar30 + 4;
            lVar35 = lVar35 + 0x10;
            iVar17 = uVar30 + 7;
            uVar30 = uVar34;
          } while (iVar17 < max_kk);
          pauVar33 = pauVar19 + 2;
          lVar16 = lVar16 + lVar35;
          lVar25 = lVar25 + lVar35;
          lVar40 = lVar40 + lVar35;
          lVar22 = lVar22 + lVar35;
        }
        if ((int)uVar34 < max_kk) {
          lVar35 = 0;
          do {
            *(undefined4 *)*pauVar33 = *(undefined4 *)(lVar22 + lVar35 * 4);
            *(undefined4 *)(*pauVar33 + 4) = *(undefined4 *)(lVar40 + lVar35 * 4);
            *(undefined4 *)(*pauVar33 + 8) = *(undefined4 *)(lVar25 + lVar35 * 4);
            *(undefined4 *)(*pauVar33 + 0xc) = *(undefined4 *)(lVar16 + lVar35 * 4);
            pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
            lVar35 = lVar35 + 1;
          } while (max_kk - uVar34 != (int)lVar35);
        }
      }
      uVar39 = uVar23 + 4;
      lVar16 = uVar23 + 7;
      lVar18 = lVar18 + lVar21;
      lVar24 = lVar24 + lVar21;
      lVar29 = lVar29 + lVar21;
      lVar42 = lVar42 + lVar21;
      uVar23 = uVar39;
    } while (lVar16 < lVar32);
  }
  if ((int)((uint)uVar39 | 1) < max_ii) {
    uVar23 = uVar39 & 0xffffffff;
    lVar18 = lVar38 * 4 + (lVar36 + uVar23 + 1) * lVar28 * 4;
    lVar24 = lVar38 * 4 + (lVar36 + uVar23) * lVar28 * 4;
    do {
      pvVar15 = A->data;
      if (max_kk < 8) {
        lVar42 = lVar38 * 4 + (uVar23 + lVar36) * lVar28 * 4;
        lVar29 = lVar38 * 4 + (lVar36 + uVar23 + 1) * lVar28 * 4;
        uVar34 = 0;
      }
      else {
        iVar27 = 7;
        lVar42 = 0;
        pauVar14 = pauVar33;
        do {
          pauVar19 = pauVar14;
          auVar1 = *(undefined1 (*) [32])((long)pvVar15 + lVar42 + lVar24);
          auVar43 = *(undefined1 (*) [32])((long)pvVar15 + lVar42 + lVar18);
          auVar44 = vunpcklps_avx(auVar1,auVar43);
          auVar1 = vunpckhps_avx(auVar1,auVar43);
          auVar43._16_16_ = auVar1._0_16_;
          auVar43._0_16_ = auVar44._0_16_;
          auVar1 = vperm2f128_avx(auVar44,auVar1,0x31);
          pauVar14 = (undefined1 (*) [32])(*pauVar33 + lVar42 * 2);
          *pauVar14 = auVar43;
          pauVar14[1] = auVar1;
          lVar42 = lVar42 + 0x20;
          iVar27 = iVar27 + 8;
          pauVar14 = pauVar14 + 2;
        } while (iVar27 < max_kk);
        pauVar33 = pauVar19 + 2;
        lVar29 = lVar42 + lVar18;
        lVar42 = lVar42 + lVar24;
        uVar34 = max_kk & 0xfffffff8;
      }
      pauVar41 = (undefined1 (*) [16])((long)pvVar15 + lVar42);
      pauVar26 = (undefined1 (*) [16])((long)pvVar15 + lVar29);
      uVar30 = uVar34 | 3;
      while ((int)uVar30 < max_kk) {
        auVar9 = vunpcklps_avx(*pauVar41,*pauVar26);
        auVar6 = vunpckhps_avx(*pauVar41,*pauVar26);
        *(undefined1 (*) [16])*pauVar33 = auVar9;
        *(undefined1 (*) [16])(*pauVar33 + 0x10) = auVar6;
        pauVar33 = pauVar33 + 1;
        pauVar41 = pauVar41 + 1;
        pauVar26 = pauVar26 + 1;
        uVar30 = uVar34 + 7;
        uVar34 = uVar34 + 4;
      }
      if ((int)uVar34 < max_kk) {
        lVar29 = 0;
        do {
          *(undefined4 *)*pauVar33 = *(undefined4 *)(*pauVar41 + lVar29 * 4);
          *(undefined4 *)(*pauVar33 + 4) = *(undefined4 *)(*pauVar26 + lVar29 * 4);
          pauVar33 = (undefined1 (*) [32])(*pauVar33 + 8);
          lVar29 = lVar29 + 1;
        } while (max_kk - uVar34 != (int)lVar29);
      }
      uVar39 = uVar23 + 2;
      lVar29 = uVar23 + 3;
      lVar18 = lVar18 + lVar28 * 8;
      lVar24 = lVar24 + lVar28 * 8;
      uVar23 = uVar39;
    } while (lVar29 < lVar32);
  }
  if ((int)uVar39 < max_ii) {
    lVar18 = (long)(int)uVar39;
    do {
      pauVar14 = (undefined1 (*) [32])((long)A->data + lVar38 * 4 + (lVar18 + lVar36) * lVar28 * 4);
      if (max_kk < 8) {
        uVar34 = 0;
      }
      else {
        iVar27 = 7;
        do {
          *pauVar33 = *pauVar14;
          pauVar33 = pauVar33 + 1;
          pauVar14 = pauVar14 + 1;
          iVar27 = iVar27 + 8;
          uVar34 = max_kk & 0xfffffff8;
        } while (iVar27 < max_kk);
      }
      uVar30 = uVar34 | 3;
      while ((int)uVar30 < max_kk) {
        *(undefined1 (*) [16])*pauVar33 = *(undefined1 (*) [16])*pauVar14;
        pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
        pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
        uVar30 = uVar34 + 7;
        uVar34 = uVar34 + 4;
      }
      if ((int)uVar34 < max_kk) {
        lVar29 = 0;
        lVar24 = 0;
        do {
          *(undefined4 *)(*pauVar33 + lVar24 * 4) = *(undefined4 *)(*pauVar14 + lVar24 * 4);
          lVar24 = lVar24 + 1;
          lVar29 = lVar29 + -4;
        } while (max_kk - uVar34 != (int)lVar24);
        pauVar33 = (undefined1 (*) [32])((long)pauVar33 - lVar29);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar32);
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 16;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;
            const float* p1 = (const float*)A + (i + ii + 8) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                _mm256_store_ps(pp + 8, _mm256_load_ps(p1));
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;
            const float* p2 = (const float*)A + (i + ii + 8) * A_hstep + k * 4;
            const float* p3 = (const float*)A + (i + ii + 12) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                _mm_store_ps(pp + 12, _mm_load_ps(p3));
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
            const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
            const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
            const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
            const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
            const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
            const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
            const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
            const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(p0);
                __m512 _r1 = _mm512_loadu_ps(p1);
                __m512 _r2 = _mm512_loadu_ps(p2);
                __m512 _r3 = _mm512_loadu_ps(p3);
                __m512 _r4 = _mm512_loadu_ps(p4);
                __m512 _r5 = _mm512_loadu_ps(p5);
                __m512 _r6 = _mm512_loadu_ps(p6);
                __m512 _r7 = _mm512_loadu_ps(p7);
                __m512 _r8 = _mm512_loadu_ps(p8);
                __m512 _r9 = _mm512_loadu_ps(p9);
                __m512 _ra = _mm512_loadu_ps(pa);
                __m512 _rb = _mm512_loadu_ps(pb);
                __m512 _rc = _mm512_loadu_ps(pc);
                __m512 _rd = _mm512_loadu_ps(pd);
                __m512 _re = _mm512_loadu_ps(pe);
                __m512 _rf = _mm512_loadu_ps(pf);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += 16;
                p1 += 16;
                p2 += 16;
                p3 += 16;
                p4 += 16;
                p5 += 16;
                p6 += 16;
                p7 += 16;
                p8 += 16;
                p9 += 16;
                pa += 16;
                pb += 16;
                pc += 16;
                pd += 16;
                pe += 16;
                pf += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp[12] = pc[0];
                pp[13] = pd[0];
                pp[14] = pe[0];
                pp[15] = pf[0];
                pp += 16;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
                pc++;
                pd++;
                pe++;
                pf++;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 16, _r2);
                _mm256_store_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}